

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlexer.cpp
# Opt level: O2

SQInteger __thiscall SQLexer::ReadString(SQLexer *this,SQInteger ndelim,bool verbatim)

{
  sqvector<char> *this_00;
  byte bVar1;
  SQUnsignedInteger SVar2;
  LexChar LVar3;
  ulong uVar4;
  char *pcVar5;
  SQChar temp [9];
  char local_39;
  SQChar *stemp;
  
  this_00 = &this->_longstr;
  temp[0] = '\0';
  sqvector<char>::resize(this_00,0,temp);
  Next(this);
  this->_currentcolumn = this->_currentcolumn + 1;
  if (this->_currdata == '\0') {
    return -1;
  }
LAB_0011ea99:
  bVar1 = this->_currdata;
  if ((ulong)bVar1 == ndelim) {
    Next(this);
    this->_currentcolumn = this->_currentcolumn + 1;
    if ((!verbatim) || (this->_currdata != '\"')) {
      temp[0] = '\0';
      sqvector<char>::push_back(this_00,temp);
      if (ndelim != 0x27) {
        this->_svalue = (this->_longstr)._vals;
        return 0x103;
      }
      SVar2 = (this->_longstr)._size;
      if (SVar2 == 1) {
        pcVar5 = "empty constant";
      }
      else {
        if ((long)(SVar2 - 1) < 2) goto LAB_0011ece2;
        pcVar5 = "constant too long";
      }
      (*this->_errfunc)(this->_errtarget,pcVar5);
LAB_0011ece2:
      this->_nvalue = (long)*(this->_longstr)._vals;
      return 0x104;
    }
LAB_0011eac1:
    temp[0] = '\"';
    bVar1 = temp[0];
  }
  else {
    if (bVar1 == 10) {
      LVar3 = '\n';
      if (!verbatim) {
        (*this->_errfunc)(this->_errtarget,"newline in a constant");
        LVar3 = this->_currdata;
      }
      temp[0] = LVar3;
      sqvector<char>::push_back(this_00,temp);
      Next(this);
      this->_currentcolumn = this->_currentcolumn + 1;
      this->_currentline = this->_currentline + 1;
      goto LAB_0011ea99;
    }
    if (bVar1 == 0x5c) {
      if (verbatim) {
LAB_0011eae3:
        temp[0] = '\\';
        bVar1 = temp[0];
      }
      else {
        Next(this);
        this->_currentcolumn = this->_currentcolumn + 1;
        LVar3 = this->_currdata;
        switch(LVar3) {
        case 'n':
          temp[0] = '\n';
          bVar1 = temp[0];
          break;
        case 'o':
        case 'p':
        case 'q':
        case 's':
        case 'w':
switchD_0011ebb0_caseD_6f:
          (*this->_errfunc)(this->_errtarget,"unrecognised escaper char");
          goto LAB_0011ea99;
        case 'r':
          temp[0] = '\r';
          bVar1 = temp[0];
          break;
        case 't':
          temp[0] = '\t';
          bVar1 = temp[0];
          break;
        case 'u':
switchD_0011ebb0_caseD_75:
          ProcessStringHexEscape(this,temp,8);
          uVar4 = strtoul(temp,&stemp,0x10);
          AddUTF8(this,uVar4);
          goto LAB_0011ea99;
        case 'v':
          temp[0] = '\v';
          bVar1 = temp[0];
          break;
        case 'x':
          ProcessStringHexEscape(this,(SQChar *)&stemp,2);
          uVar4 = strtoul((char *)&stemp,(char **)temp,0x10);
          local_39 = (char)uVar4;
          sqvector<char>::push_back(this_00,&local_39);
          goto LAB_0011ea99;
        default:
          if (LVar3 == '\"') goto LAB_0011eac1;
          if (LVar3 == '\'') {
            temp[0] = '\'';
            bVar1 = temp[0];
          }
          else if (LVar3 == '0') {
            temp[0] = '\0';
            bVar1 = temp[0];
          }
          else {
            if (LVar3 == 'U') goto switchD_0011ebb0_caseD_75;
            if (LVar3 == '\\') goto LAB_0011eae3;
            if (LVar3 == 'a') {
              temp[0] = '\a';
              bVar1 = temp[0];
            }
            else if (LVar3 == 'b') {
              temp[0] = '\b';
              bVar1 = temp[0];
            }
            else {
              if (LVar3 != 'f') goto switchD_0011ebb0_caseD_6f;
              temp[0] = '\f';
              bVar1 = temp[0];
            }
          }
        }
      }
    }
    else if (bVar1 == 0) {
      (*this->_errfunc)(this->_errtarget,"unfinished string");
      return -1;
    }
  }
  temp[0] = bVar1;
  sqvector<char>::push_back(this_00,temp);
  Next(this);
  this->_currentcolumn = this->_currentcolumn + 1;
  goto LAB_0011ea99;
}

Assistant:

SQInteger SQLexer::ReadString(SQInteger ndelim,bool verbatim)
{
    INIT_TEMP_STRING();
    NEXT();
    if(IS_EOB()) return -1;
    for(;;) {
        while(CUR_CHAR != ndelim) {
            SQInteger x = CUR_CHAR;
            switch (x) {
            case SQUIRREL_EOB:
                Error(_SC("unfinished string"));
                return -1;
            case _SC('\n'):
                if(!verbatim) Error(_SC("newline in a constant"));
                APPEND_CHAR(CUR_CHAR); NEXT();
                _currentline++;
                break;
            case _SC('\\'):
                if(verbatim) {
                    APPEND_CHAR('\\'); NEXT();
                }
                else {
                    NEXT();
                    switch(CUR_CHAR) {
                    case _SC('x'):  {
                        const SQInteger maxdigits = sizeof(SQChar) * 2;
                        SQChar temp[maxdigits + 1];
                        ProcessStringHexEscape(temp, maxdigits);
                        SQChar *stemp;
                        APPEND_CHAR((SQChar)scstrtoul(temp, &stemp, 16));
                    }
                    break;
                    case _SC('U'):
                    case _SC('u'):  {
                        const SQInteger maxdigits = x == 'u' ? 4 : 8;
                        SQChar temp[8 + 1];
                        ProcessStringHexEscape(temp, maxdigits);
                        SQChar *stemp;
#ifdef SQUNICODE
#if WCHAR_SIZE == 2
                        AddUTF16(scstrtoul(temp, &stemp, 16));
#else
                        APPEND_CHAR((SQChar)scstrtoul(temp, &stemp, 16));
#endif
#else
                        AddUTF8(scstrtoul(temp, &stemp, 16));
#endif
                    }
                    break;
                    case _SC('t'): APPEND_CHAR(_SC('\t')); NEXT(); break;
                    case _SC('a'): APPEND_CHAR(_SC('\a')); NEXT(); break;
                    case _SC('b'): APPEND_CHAR(_SC('\b')); NEXT(); break;
                    case _SC('n'): APPEND_CHAR(_SC('\n')); NEXT(); break;
                    case _SC('r'): APPEND_CHAR(_SC('\r')); NEXT(); break;
                    case _SC('v'): APPEND_CHAR(_SC('\v')); NEXT(); break;
                    case _SC('f'): APPEND_CHAR(_SC('\f')); NEXT(); break;
                    case _SC('0'): APPEND_CHAR(_SC('\0')); NEXT(); break;
                    case _SC('\\'): APPEND_CHAR(_SC('\\')); NEXT(); break;
                    case _SC('"'): APPEND_CHAR(_SC('"')); NEXT(); break;
                    case _SC('\''): APPEND_CHAR(_SC('\'')); NEXT(); break;
                    default:
                        Error(_SC("unrecognised escaper char"));
                    break;
                    }
                }
                break;
            default:
                APPEND_CHAR(CUR_CHAR);
                NEXT();
            }
        }
        NEXT();
        if(verbatim && CUR_CHAR == '"') { //double quotation
            APPEND_CHAR(CUR_CHAR);
            NEXT();
        }
        else {
            break;
        }
    }
    TERMINATE_BUFFER();
    SQInteger len = _longstr.size()-1;
    if(ndelim == _SC('\'')) {
        if(len == 0) Error(_SC("empty constant"));
        if(len > 1) Error(_SC("constant too long"));
        _nvalue = _longstr[0];
        return TK_INTEGER;
    }
    _svalue = &_longstr[0];
    return TK_STRING_LITERAL;
}